

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  ostream *poVar2;
  pointer pcVar3;
  pointer pcVar4;
  string temp;
  ostringstream msg;
  undefined1 local_1e8 [32];
  char *local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  GetExecutionFilePath_abi_cxx11_((string *)local_1e8,this);
  poVar2 = std::operator<<(&local_1a8,(string *)local_1e8);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2,"):  ");
  std::__cxx11::string::~string((string *)local_1e8);
  poVar2 = std::operator<<(&local_1a8,(string *)lff);
  std::operator<<(poVar2,"(");
  bVar1 = this->GlobalGenerator->CMakeInstance->TraceExpand;
  local_1e8._0_8_ = local_1e8 + 0x10;
  local_1e8._8_8_ = 0;
  local_1e8[0x10] = '\0';
  for (pcVar4 = (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar4 != (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar4 = pcVar4 + 1) {
    pcVar3 = pcVar4;
    if (bVar1 != false) {
      std::__cxx11::string::_M_assign((string *)local_1e8);
      ExpandVariablesInString(this,(string *)local_1e8);
      pcVar3 = (pointer)local_1e8;
    }
    std::operator<<(&local_1a8,(string *)pcVar3);
    std::operator<<(&local_1a8," ");
  }
  std::operator<<(&local_1a8,")");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(local_1c8,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  std::ostringstream msg;
  msg << this->GetExecutionFilePath() << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for(std::vector<cmListFileArgument>::const_iterator i =
        lff.Arguments.begin(); i != lff.Arguments.end(); ++i)
    {
    if (expand)
      {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
      }
    else
      {
      msg << i->Value;
      }
    msg << " ";
    }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}